

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::changeCurrentColumn(QColumnViewPrivate *this)

{
  QWidget *this_00;
  QWidget *this_01;
  QWidget *this_02;
  bool bVar1;
  QItemSelectionModel *pQVar2;
  QItemSelectionModel *pQVar3;
  QAbstractItemModel *pQVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  QAbstractItemView *pQVar8;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->columns).d.size != 0) {
    this_00 = *(QWidget **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this_00);
    if (((-1 < (int)local_58) && (-1 < (long)local_58)) &&
       (local_48.ptr != (QAbstractItemModel *)0x0)) {
      closeColumns(this,(QModelIndex *)&local_58,true);
      uVar7 = (this->columns).d.size;
      uVar6 = 2;
      if (2 < uVar7) {
        uVar6 = uVar7;
      }
      iVar5 = (int)uVar6 + -2;
      this_01 = (QWidget *)(this->columns).d.ptr[iVar5];
      bVar1 = QWidget::hasFocus(this_00);
      if (bVar1) {
        QWidget::setFocus(this_01,OtherFocusReason);
      }
      QWidget::setFocusProxy(this_00,this_01);
      for (uVar7 = 0; uVar7 < (ulong)(this->columns).d.size; uVar7 = uVar7 + 1) {
        pQVar2 = QAbstractItemView::selectionModel
                           ((QAbstractItemView *)(this->columns).d.ptr[uVar7]);
        pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
        if (pQVar2 == pQVar3) {
          pQVar2 = (QItemSelectionModel *)operator_new(0x10);
          pQVar4 = QAbstractItemView::model((QAbstractItemView *)this_01);
          QItemSelectionModel::QItemSelectionModel(pQVar2,pQVar4);
          QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
          QItemSelectionModel::currentIndex();
          (**(code **)(*(long *)pQVar2 + 0x60))(pQVar2,&local_78,0x10);
          QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
          QItemSelectionModel::selection();
          (**(code **)(*(long *)pQVar2 + 0x70))
                    (pQVar2,(QArrayDataPointer<QItemSelectionRange> *)&local_78,2);
          QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                    ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
          this_02 = (QWidget *)(this->columns).d.ptr[uVar7];
          (**(code **)(*(long *)this_02 + 0x1d0))(this_02);
          QWidget::setFocusPolicy(this_02,NoFocus);
          uVar7 = (ulong)((int)uVar7 + 1);
          if (uVar7 < (ulong)(this->columns).d.size) {
            local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_78 = &DAT_aaaaaaaaaaaaaaaa;
            puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
            QAbstractItemView::rootIndex
                      ((QModelIndex *)&local_78,(QAbstractItemView *)(this->columns).d.ptr[uVar7]);
            if (((-1 < (int)local_78) && (-1 < (long)local_78)) &&
               (local_68.ptr != (QAbstractItemModel *)0x0)) {
              QAbstractItemView::setCurrentIndex
                        ((QAbstractItemView *)this_02,(QModelIndex *)&local_78);
            }
          }
          break;
        }
      }
      QAbstractItemView::selectionModel((QAbstractItemView *)this_01);
      QObject::deleteLater();
      QWidget::setFocusPolicy(this_01,StrongFocus);
      pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this_00);
      (**(code **)(*(long *)this_01 + 0x1d0))(this_01,pQVar2);
      if (0 < iVar5) {
        pQVar8 = (QAbstractItemView *)(this->columns).d.ptr[(int)uVar6 - 3];
        QAbstractItemView::currentIndex((QModelIndex *)&local_78,pQVar8);
        QModelIndex::parent(&local_90,(QModelIndex *)&local_58);
        bVar1 = ::operator!=((QModelIndex *)&local_78,&local_90);
        if (bVar1) {
          QModelIndex::parent((QModelIndex *)&local_78,(QModelIndex *)&local_58);
          QAbstractItemView::setCurrentIndex(pQVar8,(QModelIndex *)&local_78);
        }
      }
      pQVar8 = (QAbstractItemView *)(this->columns).d.ptr[(this->columns).d.size + -1];
      if (((*(QWidgetData **)(pQVar8 + 0x20))->widget_attributes & 0x10000) != 0) {
        (**(code **)(*(long *)pQVar8 + 0x68))(pQVar8,1);
        pQVar8 = (QAbstractItemView *)(this->columns).d.ptr[(this->columns).d.size + -1];
      }
      pQVar2 = QAbstractItemView::selectionModel(pQVar8);
      if (pQVar2 != (QItemSelectionModel *)0x0) {
        pQVar2 = QAbstractItemView::selectionModel
                           ((QAbstractItemView *)(this->columns).d.ptr[(this->columns).d.size + -1])
        ;
        (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2);
      }
      updateScrollbars(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::changeCurrentColumn()
{
    Q_Q(QColumnView);
    if (columns.isEmpty())
        return;

    QModelIndex current = q->currentIndex();
    if (!current.isValid())
        return;

    // We might have scrolled far to the left so we need to close all of the children
    closeColumns(current, true);

    // Set up the "current" column with focus
    int currentColumn = qMax(0, columns.size() - 2);
    QAbstractItemView *parentColumn = columns.at(currentColumn);
    if (q->hasFocus())
        parentColumn->setFocus(Qt::OtherFocusReason);
    q->setFocusProxy(parentColumn);

    // find the column that is our current selection model and give it a new one.
    for (int i = 0; i < columns.size(); ++i) {
        if (columns.at(i)->selectionModel() == q->selectionModel()) {
            QItemSelectionModel *replacementSelectionModel =
                new QItemSelectionModel(parentColumn->model());
            replacementSelectionModel->setCurrentIndex(
                q->selectionModel()->currentIndex(), QItemSelectionModel::Current);
            replacementSelectionModel->select(
                q->selectionModel()->selection(), QItemSelectionModel::Select);
            QAbstractItemView *view = columns.at(i);
            view->setSelectionModel(replacementSelectionModel);
            view->setFocusPolicy(Qt::NoFocus);
            if (columns.size() > i + 1) {
                const QModelIndex newRootIndex = columns.at(i + 1)->rootIndex();
                if (newRootIndex.isValid())
                    view->setCurrentIndex(newRootIndex);
            }
            break;
        }
    }
    parentColumn->selectionModel()->deleteLater();
    parentColumn->setFocusPolicy(Qt::StrongFocus);
    parentColumn->setSelectionModel(q->selectionModel());
    // We want the parent selection to stay highlighted (but dimmed depending upon the color theme)
    if (currentColumn > 0) {
        parentColumn = columns.at(currentColumn - 1);
        if (parentColumn->currentIndex() != current.parent())
            parentColumn->setCurrentIndex(current.parent());
    }

    if (columns.constLast()->isHidden()) {
        columns.constLast()->setVisible(true);
    }
    if (columns.constLast()->selectionModel())
        columns.constLast()->selectionModel()->clear();
    updateScrollbars();
}